

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<capnp::Text::Reader,kj::StringPtr&>
          (StringTree *__return_storage_ptr__,kj *this,Reader *params,StringPtr *params_1)

{
  Reader *value;
  StringPtr *value_00;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  StringPtr *local_20;
  StringPtr *params_local_1;
  Reader *params_local;
  
  local_20 = &params->super_StringPtr;
  params_local_1 = (StringPtr *)this;
  params_local = (Reader *)__return_storage_ptr__;
  value = fwd<capnp::Text::Reader>((NoInfer<capnp::Text::Reader> *)this);
  local_30 = _::toStringTreeOrCharSequence<capnp::Text::Reader>(value);
  value_00 = fwd<kj::StringPtr&>(local_20);
  local_40 = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_00);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_30,&local_40,&params_1->content);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}